

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

void __thiscall Fl_Preferences::Node::createIndex(Node *this)

{
  int iVar1;
  Node *pNVar2;
  Node **ppNVar3;
  int iVar4;
  
  if ((this->field_0x30 & 4) == 0) {
    iVar4 = 0;
    for (pNVar2 = this->child_; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next_) {
      iVar4 = iVar4 + 1;
    }
    if (this->NIndex_ < iVar4) {
      this->NIndex_ = iVar4 + 0x10;
      ppNVar3 = (Node **)realloc(this->index_,(long)iVar4 * 8 + 0x80);
      this->index_ = ppNVar3;
    }
    iVar1 = iVar4;
    for (pNVar2 = this->child_; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next_) {
      iVar1 = iVar1 + -1;
      this->index_[iVar1] = pNVar2;
    }
    this->nIndex_ = iVar4;
    this->field_0x30 = this->field_0x30 | 4;
  }
  return;
}

Assistant:

void Fl_Preferences::Node::createIndex() {
  if (indexed_) return;
  int n = nChildren();
  if (n>NIndex_) {
    NIndex_ = n + 16;
    index_ = (Node**)realloc(index_, NIndex_*sizeof(Node**));
  }
  Node *nd;
  int i = 0;
  for (nd = child_; nd; nd = nd->next_, i++) {
    index_[n-i-1] = nd;
  }
  nIndex_ = n;
  indexed_ = 1;
}